

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O2

void * parallel_inc(void *arg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"thread #");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  **arg = **arg + 1;
  return (void *)0x0;
}

Assistant:

void *parallel_inc(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  while(*(p->x) != p->n);
  //usleep(1);
  std::cout << "thread #" << p->n << std::endl;
  ++*(p->x);
  return nullptr;
}